

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O1

void * AllocUnitsRare(CPpmd8 *p,uint indx)

{
  Byte *pBVar1;
  byte bVar2;
  ulong uVar3;
  uint *puVar4;
  long lVar5;
  ulong uVar6;
  Byte *pBVar7;
  uint uVar8;
  ulong uVar10;
  Byte *pBVar11;
  CPpmd8_Node_Ref head;
  uint local_1c;
  ulong uVar9;
  
  uVar3 = (ulong)indx;
  uVar9 = uVar3;
  if (p->GlueCount == 0) {
    local_1c = 0;
    p->GlueCount = 0x2000;
    memset(p->Stamps,0,0x98);
    pBVar11 = p->LoUnit;
    if (pBVar11 != p->HiUnit) {
      pBVar11[0] = '\0';
      pBVar11[1] = '\0';
      pBVar11[2] = '\0';
      pBVar11[3] = '\0';
    }
    puVar4 = &local_1c;
    lVar5 = 0;
    do {
      uVar8 = p->FreeList[lVar5];
      p->FreeList[lVar5] = 0;
      if (uVar8 != 0) {
        pBVar11 = p->Base;
        do {
          uVar6 = (ulong)uVar8;
          if (*(int *)(pBVar11 + uVar6 + 8) != 0) {
            *puVar4 = uVar8;
            puVar4 = (uint *)(pBVar11 + uVar6 + 4);
            while( true ) {
              uVar10 = (ulong)*(uint *)(pBVar11 + uVar6 + 8);
              if (*(int *)(pBVar11 + uVar10 * 0xc + uVar6) != -1) break;
              *(uint *)(pBVar11 + uVar6 + 8) =
                   *(uint *)(pBVar11 + uVar6 + 8) + *(int *)(pBVar11 + uVar10 * 0xc + uVar6 + 8);
              pBVar7 = pBVar11 + uVar10 * 0xc + uVar6 + 8;
              pBVar7[0] = '\0';
              pBVar7[1] = '\0';
              pBVar7[2] = '\0';
              pBVar7[3] = '\0';
            }
          }
          uVar8 = *(uint *)(pBVar11 + uVar6 + 4);
        } while (uVar8 != 0);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x26);
    *puVar4 = 0;
    if (local_1c != 0) {
      pBVar11 = p->Base;
      do {
        uVar6 = (ulong)local_1c;
        local_1c = *(uint *)(pBVar11 + uVar6 + 4);
        uVar8 = *(uint *)(pBVar11 + uVar6 + 8);
        if (uVar8 != 0) {
          for (; 0x80 < uVar8; uVar8 = uVar8 - 0x80) {
            pBVar7 = pBVar11 + uVar6;
            pBVar7[0] = 0xff;
            pBVar7[1] = 0xff;
            pBVar7[2] = 0xff;
            pBVar7[3] = 0xff;
            *(CPpmd_Void_Ref *)(pBVar11 + uVar6 + 4) = p->FreeList[0x25];
            *(uint *)(pBVar11 + uVar6 + 8) = (uint)p->Indx2Units[0x25];
            p->FreeList[0x25] = (CPpmd_Void_Ref)uVar6;
            p->Stamps[0x25] = p->Stamps[0x25] + 1;
            uVar6 = uVar6 + 0x600;
          }
          pBVar7 = pBVar11 + uVar6;
          uVar6 = (ulong)p->Units2Indx[uVar8 - 1];
          if (uVar8 != p->Indx2Units[uVar6]) {
            uVar6 = (ulong)(p->Units2Indx[uVar8 - 1] - 1);
            pBVar1 = pBVar7 + (ulong)p->Indx2Units[uVar6] * 0xc;
            uVar8 = uVar8 + ~(uint)p->Indx2Units[uVar6];
            pBVar1[0] = 0xff;
            pBVar1[1] = 0xff;
            pBVar1[2] = 0xff;
            pBVar1[3] = 0xff;
            *(CPpmd_Void_Ref *)(pBVar1 + 4) = p->FreeList[uVar8];
            *(uint *)(pBVar1 + 8) = (uint)p->Indx2Units[uVar8];
            p->FreeList[uVar8] = (int)pBVar1 - (int)pBVar11;
            p->Stamps[uVar8] = p->Stamps[uVar8] + 1;
          }
          pBVar7[0] = 0xff;
          pBVar7[1] = 0xff;
          pBVar7[2] = 0xff;
          pBVar7[3] = 0xff;
          *(CPpmd_Void_Ref *)(pBVar7 + 4) = p->FreeList[uVar6];
          *(uint *)(pBVar7 + 8) = (uint)p->Indx2Units[uVar6];
          p->FreeList[uVar6] = (int)pBVar7 - (int)pBVar11;
          p->Stamps[uVar6] = p->Stamps[uVar6] + 1;
        }
      } while (local_1c != 0);
    }
    uVar6 = (ulong)p->FreeList[uVar3];
    if (uVar6 != 0) {
      pBVar11 = p->Base;
      p->FreeList[uVar3] = *(CPpmd_Void_Ref *)(pBVar11 + uVar6 + 4);
      p->Stamps[uVar3] = p->Stamps[uVar3] - 1;
      return pBVar11 + uVar6;
    }
  }
  do {
    if ((int)uVar9 == 0x25) {
      bVar2 = p->Indx2Units[uVar3];
      p->GlueCount = p->GlueCount - 1;
      if ((uint)bVar2 * 0xc < (uint)((int)p->UnitsStart - *(int *)&p->Text)) {
        pBVar11 = p->UnitsStart + (ulong)bVar2 * -0xc;
        p->UnitsStart = pBVar11;
        return pBVar11;
      }
      return (void *)0x0;
    }
    uVar8 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar8;
    uVar6 = (ulong)p->FreeList[uVar9];
  } while (uVar6 == 0);
  pBVar11 = p->Base + uVar6;
  p->FreeList[uVar9] = *(CPpmd_Void_Ref *)(p->Base + uVar6 + 4);
  p->Stamps[uVar9] = p->Stamps[uVar9] - 1;
  SplitBlock(p,pBVar11,uVar8,indx);
  return pBVar11;
}

Assistant:

static void *AllocUnitsRare(CPpmd8 *p, unsigned indx)
{
  unsigned i;
  void *retVal;
  if (p->GlueCount == 0)
  {
    GlueFreeBlocks(p);
    if (p->FreeList[indx] != 0)
      return RemoveNode(p, indx);
  }
  i = indx;
  do
  {
    if (++i == PPMD_NUM_INDEXES)
    {
      UInt32 numBytes = U2B(I2U(indx));
      p->GlueCount--;
      return ((UInt32)(p->UnitsStart - p->Text) > numBytes) ? (p->UnitsStart -= numBytes) : (NULL);
    }
  }
  while (p->FreeList[i] == 0);
  retVal = RemoveNode(p, i);
  SplitBlock(p, retVal, i, indx);
  return retVal;
}